

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::InitializeStaticSRBResources
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,IShaderResourceBinding *pSRB)

{
  undefined *puVar1;
  undefined8 uVar2;
  PipelineResourceSignatureImplType *this_00;
  undefined1 local_38 [8];
  string _msg;
  IShaderResourceBinding *pSRB_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  _msg.field_2._8_8_ = pSRB;
  CheckPipelineReady(this);
  if ((this->m_UsingImplicitSignature & 1U) == 0) {
    FormatString<char[183]>
              ((string *)local_38,
               (char (*) [183])
               "IPipelineState::InitializeStaticSRBResources is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::InitializeStaticSRBResources instead."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    this_00 = GetResourceSignature(this,0);
    PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::InitializeStaticSRBResources
              (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
               (IShaderResourceBinding *)_msg.field_2._8_8_);
  }
  return;
}

Assistant:

InitializeStaticSRBResources(IShaderResourceBinding* pSRB) const override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::InitializeStaticSRBResources is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::InitializeStaticSRBResources instead.");
            return;
        }

        return this->GetResourceSignature(0)->InitializeStaticSRBResources(pSRB);
    }